

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::Heap::addIfHeapEntity
          (Heap *this,HeapEntity *v,
          vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
          *vec)

{
  _func_int **pp_Var1;
  _func_int **__src;
  ulong uVar2;
  pointer __dest;
  ulong uVar3;
  size_t __n;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  *this_00;
  
  pp_Var1 = *(_func_int ***)&v->mark;
  if (pp_Var1 == v[1]._vptr_HeapEntity) {
    __src = v->_vptr_HeapEntity;
    __n = (long)pp_Var1 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar3 = (long)__n >> 3;
    uVar2 = 1;
    if (pp_Var1 != __src) {
      uVar2 = uVar3;
    }
    this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
               *)(uVar2 + uVar3);
    if ((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
         *)0xffffffffffffffe < this_00) {
      this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 *)0xfffffffffffffff;
    }
    if (CARRY8(uVar2,uVar3)) {
      this_00 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                 *)0xfffffffffffffff;
    }
    __dest = std::
             _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ::_M_allocate(this_00,(size_t)v);
    *(Heap **)((long)__dest + __n) = this;
    if (0 < (long)__n) {
      memmove(__dest,__src,__n);
    }
    if (__src != (_func_int **)0x0) {
      operator_delete(__src,(long)v[1]._vptr_HeapEntity - (long)__src);
    }
    v->_vptr_HeapEntity = (_func_int **)__dest;
    *(size_t *)&v->mark = (long)__dest + __n + 8;
    v[1]._vptr_HeapEntity = (_func_int **)(__dest + (long)this_00);
  }
  else {
    *pp_Var1 = (_func_int *)this;
    *(long *)&v->mark = *(long *)&v->mark + 8;
  }
  return;
}

Assistant:

void addIfHeapEntity(HeapEntity *v, std::vector<HeapEntity *> &vec)
    {
        vec.push_back(v);
    }